

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pose.h
# Opt level: O2

Vector6d * gmath::getPose(Vector6d *__return_storage_ptr__,Matrix33d *R,Vector3d *T)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Vector3d n;
  SVector<double,_3> local_38;
  
  SVector<double,_3>::SVector(&local_38);
  dVar3 = recoverAngleAxis(R,&local_38);
  dVar1 = T->v[2];
  dVar2 = T->v[1];
  __return_storage_ptr__->v[0] = T->v[0];
  __return_storage_ptr__->v[1] = dVar2;
  __return_storage_ptr__->v[2] = dVar1;
  __return_storage_ptr__->v[5] = 0.0;
  __return_storage_ptr__->v[3] = 0.0;
  __return_storage_ptr__->v[4] = 0.0;
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    __return_storage_ptr__->v[3] = dVar3 * local_38.v[0];
    __return_storage_ptr__->v[4] = dVar3 * local_38.v[1];
    __return_storage_ptr__->v[5] = dVar3 * local_38.v[2];
  }
  return __return_storage_ptr__;
}

Assistant:

inline Vector6d getPose(const Matrix33d &R, const Vector3d &T)
{
  Vector3d n;
  double   phi=recoverAngleAxis(R, n);
  Vector6d pose(T[0], T[1], T[2], 0, 0, 0);

  if (phi != 0)
  {
    pose[3]=n[0]*phi;
    pose[4]=n[1]*phi;
    pose[5]=n[2]*phi;
  }

  return pose;
}